

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,ProtocolError protocolError)

{
  Promise<void> *pPVar1;
  Promise<void> *in_RSI;
  Promise<void> *pPVar2;
  Promise<void> promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  
  *(undefined1 *)((long)&in_RSI[0x2c].super_PromiseBase.node.ptr + 4) = 1;
  pPVar1 = (Promise<void> *)
           in_RSI[3].super_PromiseBase.node.ptr[5].super_PromiseArenaMember._vptr_PromiseArenaMember
  ;
  pPVar2 = in_RSI + 2;
  if (pPVar1 != (Promise<void> *)0x0) {
    pPVar2 = pPVar1;
  }
  (*(code *)(((pPVar2->super_PromiseBase).node.ptr)->super_PromiseArenaMember).
            _vptr_PromiseArenaMember)(&local_20);
  local_28.ptr = local_20.ptr;
  local_20.ptr = (PromiseNode *)0x0;
  finishSendingError(this,in_RSI);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(HttpHeaders::ProtocolError protocolError) {
    closeAfterSend = true;

    // Client protocol errors always happen on request headers parsing, before we call into the
    // HttpService, meaning no response has been sent and we can provide a Response object.
    auto promise = server.settings.errorHandler.orDefault(*this).handleClientProtocolError(
        kj::mv(protocolError), *this);
    return finishSendingError(kj::mv(promise));
  }